

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars,XMLCh *repText1,
          XMLCh *repText2,XMLCh *repText3,XMLCh *repText4,MemoryManager *manager)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = (*(this->super_XMLMsgLoader)._vptr_XMLMsgLoader[2])
                    (this,CONCAT44(in_register_00000034,msgToLoad));
  if (SUB41(iVar1,0) != false) {
    XMLString::replaceTokens(toFill,maxChars,repText1,repText2,repText3,repText4,manager);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars
                            , const XMLCh* const            repText1
                            , const XMLCh* const            repText2
                            , const XMLCh* const            repText3
                            , const XMLCh* const            repText4
                            , MemoryManager* const          manager)
{
    // Call the other version to load up the message
    if (!loadMsg(msgToLoad, toFill, maxChars))
        return false;

    // And do the token replacement
    XMLString::replaceTokens(toFill, maxChars, repText1, repText2, repText3, repText4, manager);
    return true;
}